

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdhopt.c
# Opt level: O3

int mbedtls_ecdhopt_responder
              (mbedtls_ecdhopt_context *ctx,size_t *olen,uchar *buf,size_t blen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uchar base [32];
  uint8_t local_38;
  undefined1 auStack_37 [15];
  undefined1 local_28 [16];
  
  if (ctx == (mbedtls_ecdhopt_context *)0x0) {
    iVar1 = -0x4f80;
  }
  else {
    if (ctx->curve != MBEDTLS_ECP_DP_CURVE25519) {
      (ctx->ctx).ec.point_format = ctx->point_format;
      iVar1 = mbedtls_ecdh_make_public(&(ctx->ctx).ec,olen,buf,blen,f_rng,p_rng);
      return iVar1;
    }
    local_28 = (undefined1  [16])0x0;
    *olen = 0x21;
    iVar1 = -0x4f00;
    if (0x20 < blen) {
      *buf = ' ';
      auStack_37 = SUB1615((undefined1  [16])0x0,1);
      local_38 = '\t';
      Hacl_Curve25519_crypto_scalarmult(buf + 1,(uint8_t *)&ctx->ctx,&local_38);
      auVar3[0] = -(buf[0x11] == local_28[0]);
      auVar3[1] = -(buf[0x12] == local_28[1]);
      auVar3[2] = -(buf[0x13] == local_28[2]);
      auVar3[3] = -(buf[0x14] == local_28[3]);
      auVar3[4] = -(buf[0x15] == local_28[4]);
      auVar3[5] = -(buf[0x16] == local_28[5]);
      auVar3[6] = -(buf[0x17] == local_28[6]);
      auVar3[7] = -(buf[0x18] == local_28[7]);
      auVar3[8] = -(buf[0x19] == local_28[8]);
      auVar3[9] = -(buf[0x1a] == local_28[9]);
      auVar3[10] = -(buf[0x1b] == local_28[10]);
      auVar3[0xb] = -(buf[0x1c] == local_28[0xb]);
      auVar3[0xc] = -(buf[0x1d] == local_28[0xc]);
      auVar3[0xd] = -(buf[0x1e] == local_28[0xd]);
      auVar3[0xe] = -(buf[0x1f] == local_28[0xe]);
      auVar3[0xf] = -(buf[0x20] == local_28[0xf]);
      auVar2[0] = -(buf[1] == '\0');
      auVar2[1] = -(buf[2] == auStack_37[0]);
      auVar2[2] = -(buf[3] == auStack_37[1]);
      auVar2[3] = -(buf[4] == auStack_37[2]);
      auVar2[4] = -(buf[5] == auStack_37[3]);
      auVar2[5] = -(buf[6] == auStack_37[4]);
      auVar2[6] = -(buf[7] == auStack_37[5]);
      auVar2[7] = -(buf[8] == auStack_37[6]);
      auVar2[8] = -(buf[9] == auStack_37[7]);
      auVar2[9] = -(buf[10] == auStack_37[8]);
      auVar2[10] = -(buf[0xb] == auStack_37[9]);
      auVar2[0xb] = -(buf[0xc] == auStack_37[10]);
      auVar2[0xc] = -(buf[0xd] == auStack_37[0xb]);
      auVar2[0xd] = -(buf[0xe] == auStack_37[0xc]);
      auVar2[0xe] = -(buf[0xf] == auStack_37[0xd]);
      auVar2[0xf] = -(buf[0x10] == auStack_37[0xe]);
      auVar2 = auVar2 & auVar3;
      iVar1 = -0x4d00;
      if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar2[0xf] >> 7) << 0xf) != 0xffff) {
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecdhopt_responder( mbedtls_ecdhopt_context *ctx, size_t *olen,
                      unsigned char *buf, size_t blen,
                      int (*f_rng)(void *, unsigned char *, size_t),
                      void *p_rng )
{
    if( ctx == NULL )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( ctx->curve == MBEDTLS_ECP_DP_CURVE25519 )
    {
        unsigned char base[32] = {0};
        *olen = 33;
        if( blen < *olen )
            return( MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL );
        *buf++ = 32;

        base[0] = 9; // generator of x25519
        Hacl_Curve25519_crypto_scalarmult( buf, ctx->ctx.x25519.our_secret, base );

        base[0] = 0;
        if( memcmp( buf, base, 32) == 0 )
            return MBEDTLS_ERR_ECP_RANDOM_FAILED;

        return( 0 );
    }
    else
    {
        ctx->ctx.ec.point_format = ctx->point_format;
        return mbedtls_ecdh_make_public( &ctx->ctx.ec, olen, buf, blen, f_rng, p_rng );
    }
}